

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  SessionHandle *data_00;
  long lVar1;
  _Bool _Var2;
  SessionHandle *data;
  connectbundle *new_bundle;
  connectbundle *bundle;
  connectdata *pcStack_20;
  CURLcode result;
  connectdata *conn_local;
  conncache *connc_local;
  
  data = (SessionHandle *)0x0;
  data_00 = conn->data;
  pcStack_20 = conn;
  conn_local = (connectdata *)connc;
  new_bundle = Curl_conncache_find_bundle((data_00->state).conn_cache,(conn->host).name);
  if (new_bundle == (connectbundle *)0x0) {
    bundle._4_4_ = Curl_bundle_create(data_00,(connectbundle **)&data);
    if (bundle._4_4_ != CURLE_OK) {
      return bundle._4_4_;
    }
    _Var2 = conncache_add_bundle
                      ((data_00->state).conn_cache,(pcStack_20->host).name,(connectbundle *)data);
    if (!_Var2) {
      Curl_bundle_destroy((connectbundle *)data);
      return CURLE_OUT_OF_MEMORY;
    }
    new_bundle = (connectbundle *)data;
  }
  bundle._4_4_ = Curl_bundle_add_conn(new_bundle,pcStack_20);
  if (bundle._4_4_ == CURLE_OK) {
    lVar1 = *(long *)((conn_local->chunk).hexbuffer + 8);
    *(long *)((conn_local->chunk).hexbuffer + 8) = lVar1 + 1;
    pcStack_20->connection_id = lVar1;
    *(long *)(conn_local->chunk).hexbuffer = *(long *)(conn_local->chunk).hexbuffer + 1;
    connc_local._4_4_ = CURLE_OK;
  }
  else {
    if (data != (SessionHandle *)0x0) {
      conncache_remove_bundle((data_00->state).conn_cache,(connectbundle *)data);
    }
    connc_local._4_4_ = bundle._4_4_;
  }
  return connc_local._4_4_;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct SessionHandle *data = conn->data;

  bundle = Curl_conncache_find_bundle(data->state.conn_cache,
                                      conn->host.name);
  if(!bundle) {
    result = Curl_bundle_create(data, &new_bundle);
    if(result != CURLE_OK)
      return result;

    if(!conncache_add_bundle(data->state.conn_cache,
                             conn->host.name, new_bundle)) {
      Curl_bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }
    bundle = new_bundle;
  }

  result = Curl_bundle_add_conn(bundle, conn);
  if(result != CURLE_OK) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    return result;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_connections++;

  return CURLE_OK;
}